

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Neighbor_alltoall
              (void *sendbuf,int sendcount,MPIABI_Datatype senddtype,void *recvbuf,int recvcount,
              MPIABI_Datatype recvtype,MPIABI_Comm comm)

{
  void *pvVar1;
  int iVar2;
  ompi_datatype_t *poVar3;
  ompi_datatype_t *poVar4;
  ompi_communicator_t *poVar5;
  WPI_Handle<ompi_communicator_t_*> local_50;
  WPI_Handle<ompi_datatype_t_*> local_48;
  WPI_Handle<ompi_datatype_t_*> local_40;
  MPIABI_Datatype local_38;
  MPIABI_Datatype recvtype_local;
  void *pvStack_28;
  int recvcount_local;
  void *recvbuf_local;
  MPIABI_Datatype senddtype_local;
  void *pvStack_10;
  int sendcount_local;
  void *sendbuf_local;
  
  local_38 = recvtype;
  recvtype_local._4_4_ = recvcount;
  pvStack_28 = recvbuf;
  recvbuf_local = (void *)senddtype;
  senddtype_local._4_4_ = sendcount;
  pvStack_10 = sendbuf;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle(&local_40,senddtype);
  poVar3 = WPI_Handle::operator_cast_to_ompi_datatype_t_((WPI_Handle *)&local_40);
  pvVar1 = pvStack_28;
  iVar2 = recvtype_local._4_4_;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle(&local_48,local_38);
  poVar4 = WPI_Handle::operator_cast_to_ompi_datatype_t_((WPI_Handle *)&local_48);
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle(&local_50,comm);
  poVar5 = WPI_Handle::operator_cast_to_ompi_communicator_t_((WPI_Handle *)&local_50);
  iVar2 = MPI_Neighbor_alltoall(sendbuf,sendcount,poVar3,pvVar1,iVar2,poVar4,poVar5);
  return iVar2;
}

Assistant:

int MPIABI_Neighbor_alltoall(
  const void * sendbuf,
  int sendcount,
  MPIABI_Datatype senddtype,
  void * recvbuf,
  int recvcount,
  MPIABI_Datatype recvtype,
  MPIABI_Comm comm
) {
  return MPI_Neighbor_alltoall(
    sendbuf,
    sendcount,
    (MPI_Datatype)(WPI_Datatype)senddtype,
    recvbuf,
    recvcount,
    (MPI_Datatype)(WPI_Datatype)recvtype,
    (MPI_Comm)(WPI_Comm)comm
  );
}